

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void store_reset(void)

{
  _Bool _Var1;
  town *town_00;
  store *local_20;
  store *s;
  town *town;
  wchar_t j;
  wchar_t i;
  
  for (town._4_4_ = 0; town._4_4_ < world->num_towns; town._4_4_ = town._4_4_ + 1) {
    town_00 = (town *)(world->towns + town._4_4_);
    local_20 = town_00->stores;
    if (town_00->index == (int)player->home) {
      place_home(town_00);
    }
    else {
      _Var1 = store_is_home(local_20);
      if (_Var1) {
        town_00->stores = local_20->next;
        free_store(local_20);
        local_20 = town_00->stores;
      }
    }
    while (local_20 != (store *)0x0) {
      local_20->stock_num = '\0';
      object_pile_free((chunk *)0x0,(chunk *)0x0,local_20->stock_k);
      object_pile_free((chunk *)0x0,(chunk *)0x0,local_20->stock);
      local_20->stock_k = (object *)0x0;
      local_20->stock = (object *)0x0;
      _Var1 = store_is_home(local_20);
      if (_Var1) {
        local_20 = local_20->next;
      }
      else {
        store_shuffle(local_20);
        for (town._0_4_ = 0; (int)town < 10; town._0_4_ = (int)town + 1) {
          store_maint(local_20);
        }
        local_20 = local_20->next;
      }
    }
  }
  return;
}

Assistant:

void store_reset(void) {
	int i, j;

	for (i = 0; i < world->num_towns; i++) {
		struct town *town = &world->towns[i];
		struct store *s = town->stores;

		/* Place the home in the hometown */
		if (town->index == player->home) {
			place_home(town);
		} else {
			/* May need to remove previous home for a dead character */
			if (store_is_home(s)) {
				town->stores = s->next;
				free_store(s);
				s = town->stores;
			}
		}

		/* Initial stock setup for stores */
		while (s) {
			s->stock_num = 0;
			object_pile_free(NULL, NULL, s->stock_k);
			object_pile_free(NULL, NULL, s->stock);
			s->stock_k = NULL;
			s->stock = NULL;
			if (store_is_home(s)) {
				s = s->next;
				continue;
			}
			store_shuffle(s);
			for (j = 0; j < 10; j++)
				store_maint(s);
			s = s->next;
		}
	}
}